

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_uncompress_zdebug
              (backtrace_state *state,uchar *compressed,size_t compressed_size,
              uint16_t *zdebug_table,backtrace_error_callback error_callback,void *data,
              uchar **uncompressed,size_t *uncompressed_size)

{
  int iVar1;
  uchar *local_58;
  uchar *po;
  size_t i;
  size_t sz;
  void *data_local;
  backtrace_error_callback error_callback_local;
  uint16_t *zdebug_table_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  backtrace_state *state_local;
  
  *uncompressed = (uchar *)0x0;
  *uncompressed_size = 0;
  if ((0xb < compressed_size) && (*(int *)compressed == 0x42494c5a)) {
    i = 0;
    for (po = (uchar *)0x0; po < (uchar *)0x8; po = po + 1) {
      i = i << 8 | (ulong)(compressed + 4)[(long)po];
    }
    if ((*uncompressed == (uchar *)0x0) || (*uncompressed_size < i)) {
      local_58 = (uchar *)tcmalloc_backtrace_alloc(state,i,error_callback,data);
      if (local_58 == (uchar *)0x0) {
        return 0;
      }
    }
    else {
      local_58 = *uncompressed;
    }
    iVar1 = elf_zlib_inflate_and_verify
                      (compressed + 0xc,compressed_size - 0xc,zdebug_table,local_58,i);
    if (iVar1 != 0) {
      *uncompressed = local_58;
      *uncompressed_size = i;
    }
  }
  return 1;
}

Assistant:

static int
elf_uncompress_zdebug (struct backtrace_state *state,
		       const unsigned char *compressed, size_t compressed_size,
		       uint16_t *zdebug_table,
		       backtrace_error_callback error_callback, void *data,
		       unsigned char **uncompressed, size_t *uncompressed_size)
{
  size_t sz;
  size_t i;
  unsigned char *po;

  *uncompressed = NULL;
  *uncompressed_size = 0;

  /* The format starts with the four bytes ZLIB, followed by the 8
     byte length of the uncompressed data in big-endian order,
     followed by a zlib stream.  */

  if (compressed_size < 12 || memcmp (compressed, "ZLIB", 4) != 0)
    return 1;

  sz = 0;
  for (i = 0; i < 8; i++)
    sz = (sz << 8) | compressed[i + 4];

  if (*uncompressed != NULL && *uncompressed_size >= sz)
    po = *uncompressed;
  else
    {
      po = (unsigned char *) backtrace_alloc (state, sz, error_callback, data);
      if (po == NULL)
	return 0;
    }

  if (!elf_zlib_inflate_and_verify (compressed + 12, compressed_size - 12,
				    zdebug_table, po, sz))
    return 1;

  *uncompressed = po;
  *uncompressed_size = sz;

  return 1;
}